

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type cm::operator==(char **l,
                   StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *r)

{
  bool bVar1;
  string local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  string_view local_28;
  StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_18;
  StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *r_local;
  char **l_local;
  
  local_18 = r;
  r_local = (StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *)l;
  local_28 = AsStringView<char_*>::view(*l);
  StringOpPlus::operator_cast_to_string(&local_58,(StringOpPlus *)local_18);
  local_38 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  bVar1 = std::operator==(local_28,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

typename std::enable_if<AsStringView<L>::value, bool>::type operator==(
  L&& l, StringOpPlus<RL, RR> const& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) == std::string(r);
}